

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

ostream * embree::emitXML(ostream *cout,Ref<embree::XML> *xml,size_t depth)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pRVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  XML *pXVar7;
  _Base_ptr p_Var8;
  char *pcVar9;
  size_t i;
  ulong uVar10;
  size_t i_1;
  long lVar11;
  _Self __tmp;
  
  if (depth == 0) {
    poVar6 = std::operator<<(cout,"<?xml version=\"1.0\"?>");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  indent(cout,depth);
  poVar6 = std::operator<<(cout,"<");
  std::operator<<(poVar6,(string *)&xml->ptr->name);
  pXVar7 = xml->ptr;
  p_Var8 = (pXVar7->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var8 != &(pXVar7->parms)._M_t._M_impl.super__Rb_tree_header) {
    poVar6 = std::operator<<(cout," ");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 1));
    poVar6 = std::operator<<(poVar6,"=");
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 2));
    std::operator<<(poVar6,"\"");
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    pXVar7 = xml->ptr;
  }
  if (((pXVar7->children).
       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (pXVar7->children).
       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     ((pXVar7->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (pXVar7->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    poVar6 = std::operator<<(cout,"/>");
    std::endl<char,std::char_traits<char>>(poVar6);
    return cout;
  }
  std::operator<<(cout,">");
  pXVar7 = xml->ptr;
  pTVar1 = (pXVar7->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (pXVar7->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((ulong)(((long)pTVar2 - (long)pTVar1) / 0x48) < 0x10) &&
     ((pXVar7->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (pXVar7->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    bVar4 = true;
    bVar5 = true;
    if (pTVar2 == pTVar1) goto LAB_0019763e;
LAB_001975af:
    lVar11 = 0;
    for (uVar10 = 0;
        pTVar1 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)(((long)(xml->ptr->body).
                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x48);
        uVar10 = uVar10 + 1) {
      poVar6 = operator<<(cout,(Token *)((long)&pTVar1->ty + lVar11));
      pcVar9 = "";
      if (uVar10 != ((long)(xml->ptr->body).
                           super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x48 - 1U) {
        pcVar9 = " ";
      }
      std::operator<<(poVar6,pcVar9);
      lVar11 = lVar11 + 0x48;
    }
    bVar4 = true;
    if (bVar5) goto LAB_0019763e;
    std::endl<char,std::char_traits<char>>(cout);
  }
  else {
    std::endl<char,std::char_traits<char>>(cout);
    if ((xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
        super__Vector_impl_data._M_start) {
      indent(cout,depth + 1);
      bVar5 = false;
      goto LAB_001975af;
    }
  }
  bVar4 = false;
LAB_0019763e:
  lVar11 = 0;
  for (uVar10 = 0;
      pRVar3 = (xml->ptr->children).
               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(xml->ptr->children).
                             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 3);
      uVar10 = uVar10 + 1) {
    emitXML(cout,(Ref<embree::XML> *)((long)&pRVar3->ptr + lVar11),depth + 1);
    lVar11 = lVar11 + 8;
  }
  if (!bVar4) {
    indent(cout,depth);
  }
  poVar6 = std::operator<<(cout,"</");
  poVar6 = std::operator<<(poVar6,(string *)&xml->ptr->name);
  poVar6 = std::operator<<(poVar6,">");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  return poVar6;
}

Assistant:

std::ostream& emitXML(std::ostream& cout, const Ref<XML>& xml, size_t depth = 0)
  {
    /* print header */
    if (depth == 0) cout << "<?xml version=\"1.0\"?>" << std::endl << std::endl;

    /* print tag opening */
    indent(cout,depth); cout << "<" << xml->name;
    for (std::map<std::string,std::string>::const_iterator i=xml->parms.begin(); i!=xml->parms.end(); i++)
      cout << " " << i->first << "=" << "\"" << i->second << "\"";
    if (xml->children.size() == 0 && xml->body.size() == 0) {
      cout << "/>" << std::endl;
      return cout;
    }
    cout << ">";

    bool compact = xml->body.size() < 16 && xml->children.size() == 0;
    if (!compact) cout << std::endl;

    /* print token list */
    if (xml->body.size()) {
      if (!compact) indent(cout,depth+1);
      for (size_t i=0; i<xml->body.size(); i++)
        cout << xml->body[i] << (i!=xml->body.size()-1?" ":"");
      if (!compact) cout << std::endl;
    }

    /* print children */
    for (size_t i=0; i<xml->children.size(); i++)
      emitXML(cout,xml->children[i],depth+1);

    /* print tag closing */
    if (!compact) indent(cout,depth);
    return cout << "</" << xml->name << ">" << std::endl;
  }